

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O0

void assert_hex_decode(string *input,string *expected)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 local_38 [8];
  string actual;
  string *expected_local;
  string *input_local;
  
  actual.field_2._8_8_ = expected;
  QUtil::hex_decode((string *)local_38,input);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          actual.field_2._8_8_,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"hex encode ");
    poVar2 = std::operator<<(poVar2,(string *)input);
    poVar2 = std::operator<<(poVar2,": expected = ");
    poVar2 = std::operator<<(poVar2,(string *)actual.field_2._8_8_);
    poVar2 = std::operator<<(poVar2,"; actual = ");
    poVar2 = std::operator<<(poVar2,(string *)local_38);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void
assert_hex_decode(std::string const& input, std::string const& expected)
{
    std::string actual = QUtil::hex_decode(input);
    if (expected != actual) {
        std::cout << "hex encode " << input << ": expected = " << expected
                  << "; actual = " << actual << std::endl;
    }
}